

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semaphore.hpp
# Opt level: O3

void __thiscall tf::Semaphore::_release(Semaphore *this,SmallVector<tf::Node_*,_2U> *dst)

{
  iterator ppNVar1;
  int iVar2;
  ulong uVar3;
  Node **To;
  Node **From;
  iterator I;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    uVar3 = *(ulong *)(this + 0x30);
    if (*(ulong *)(this + 0x28) <= uVar3) {
      throw_re<char_const(&)[58],unsigned_long&>
                ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/core/semaphore.hpp"
                 ,0x97,(char (*) [58])"can\'t release the semaphore more than its maximum value: ",
                 (unsigned_long *)(this + 0x28));
      uVar3 = *(ulong *)(this + 0x30);
    }
    *(ulong *)(this + 0x30) = uVar3 + 1;
    ppNVar1 = (iterator)
              (dst->super_SmallVectorImpl<tf::Node_*>).
              super_SmallVectorTemplateBase<tf::Node_*,_true>.
              super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
    I = (iterator)
        (dst->super_SmallVectorImpl<tf::Node_*>).super_SmallVectorTemplateBase<tf::Node_*,_true>.
        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
    if (ppNVar1 == I) {
      SmallVectorImpl<tf::Node_*>::swap
                (&dst->super_SmallVectorImpl<tf::Node_*>,
                 (SmallVectorImpl<tf::Node_*> *)(this + 0x38));
    }
    else {
      From = *(Node ***)(this + 0x38);
      To = *(Node ***)(this + 0x40);
      uVar3 = ((long)To - (long)From >> 3) + ((long)I - (long)ppNVar1 >> 3);
      if ((ulong)((long)(dst->super_SmallVectorImpl<tf::Node_*>).
                        super_SmallVectorTemplateBase<tf::Node_*,_true>.
                        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.
                        CapacityX - (long)ppNVar1 >> 3) < uVar3) {
        SmallVectorBase::grow_pod
                  ((SmallVectorBase *)dst,
                   &(dst->super_SmallVectorImpl<tf::Node_*>).
                    super_SmallVectorTemplateBase<tf::Node_*,_true>.
                    super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl,uVar3 * 8,8);
        I = (iterator)
            (dst->super_SmallVectorImpl<tf::Node_*>).super_SmallVectorTemplateBase<tf::Node_*,_true>
            .super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
        From = *(Node ***)(this + 0x38);
        To = *(Node ***)(this + 0x40);
      }
      SmallVectorImpl<tf::Node*>::insert<tf::Node**>((SmallVectorImpl<tf::Node*> *)dst,I,From,To);
      *(undefined8 *)(this + 0x40) = *(undefined8 *)(this + 0x38);
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

inline void Semaphore::_release(SmallVector<Node*>& dst) {

  std::lock_guard<std::mutex> lock(_mtx);

  if(_cur_value >= _max_value) {
    TF_THROW("can't release the semaphore more than its maximum value: ", _max_value);
  }

  ++_cur_value;
  
  if(dst.empty()) {
    dst.swap(_waiters);
  }
  else {
    dst.reserve(dst.size() + _waiters.size());
    dst.insert(dst.end(), _waiters.begin(), _waiters.end());
    _waiters.clear();
  }
}